

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

bool __thiscall
flatbuffers::Parser::ParseFlexBuffer
          (Parser *this,char *source,char *source_filename,Builder *builder)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 in_RAX;
  byte bVar4;
  undefined1 auStack_38 [5];
  undefined1 local_33;
  char local_32;
  
  iVar1 = this->parse_depth_counter_;
  _auStack_38 = in_RAX;
  StartParseFile((Parser *)(auStack_38 + 6),(char *)this,source);
  uVar2 = _auStack_38;
  _auStack_38 = CONCAT17(1,_auStack_38);
  uVar3 = _auStack_38;
  local_32 = SUB81(uVar2,6);
  _auStack_38 = uVar3;
  if (local_32 == '\0') {
    ParseFlexBufferValue((Parser *)(auStack_38 + 4),(Builder *)this);
    uVar2 = _auStack_38;
    _auStack_38 = CONCAT15(1,auStack_38);
    uVar3 = _auStack_38;
    auStack_38[4] = SUB81(uVar2,4);
    bVar4 = auStack_38[4] ^ 1;
    _auStack_38 = uVar3;
  }
  else {
    bVar4 = 0;
  }
  if (bVar4 != 0) {
    flexbuffers::Builder::Finish(builder);
  }
  if (iVar1 == this->parse_depth_counter_) {
    return (bool)bVar4;
  }
  __assert_fail("initial_depth == parse_depth_counter_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                ,0xd83,
                "bool flatbuffers::Parser::ParseFlexBuffer(const char *, const char *, flexbuffers::Builder *)"
               );
}

Assistant:

bool Parser::ParseFlexBuffer(const char *source, const char *source_filename,
                             flexbuffers::Builder *builder) {
  const auto initial_depth = parse_depth_counter_;
  (void)initial_depth;
  auto ok = !StartParseFile(source, source_filename).Check() &&
            !ParseFlexBufferValue(builder).Check();
  if (ok) builder->Finish();
  FLATBUFFERS_ASSERT(initial_depth == parse_depth_counter_);
  return ok;
}